

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O1

void __thiscall QPainter::setBrush(QPainter *this,QColor color)

{
  uint *puVar1;
  _Head_base<0UL,_QPainterPrivate_*,_false> _Var2;
  QColor rhs;
  QColor color_00;
  undefined1 *puVar3;
  undefined1 *puVar4;
  bool bVar5;
  long in_FS_OFFSET;
  undefined1 *local_28;
  undefined1 *puStack_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  _Var2._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
       super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
  if ((tuple<QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>)
      *(tuple<QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor> *)
       &((_Var2._M_head_impl)->engine)._M_t ==
      (__uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>)0x0) {
    setBrush();
  }
  else {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    puVar3 = color._0_8_;
    puVar4 = color._8_8_;
    if (color.cspec == Invalid) {
      QColor::QColor((QColor *)&local_28,black);
      puVar3 = local_28;
      puVar4 = puStack_20;
    }
    puStack_20 = puVar4;
    local_28 = puVar3;
    rhs._8_8_ = puStack_20;
    rhs._0_8_ = local_28;
    bVar5 = QBrush::doCompareEqualColor
                      ((QBrush *)((long)((_Var2._M_head_impl)->state)._M_t + 0x48),rhs);
    if (!bVar5) {
      color_00._8_8_ = puStack_20;
      color_00._0_8_ = local_28;
      QBrush::operator=((QBrush *)((long)((_Var2._M_head_impl)->state)._M_t + 0x48),color_00);
      if ((_Var2._M_head_impl)->extended == (QPaintEngineEx *)0x0) {
        puVar1 = (uint *)((long)((_Var2._M_head_impl)->state)._M_t + 8);
        *puVar1 = *puVar1 | 2;
      }
      else {
        (**(code **)(*(long *)&(_Var2._M_head_impl)->extended->super_QPaintEngine + 0x110))();
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPainter::setBrush(QColor color)
{
    Q_D(QPainter);
    if (!d->engine) {
        qWarning("QPainter::setBrush: Painter not active");
        return;
    }

    const QColor actualColor = color.isValid() ? color : QColor(Qt::black);
    if (d->state->brush == actualColor)
        return;
    d->state->brush = actualColor;
    if (d->extended)
        d->extended->brushChanged();
    else
        d->state->dirtyFlags |= QPaintEngine::DirtyBrush;
}